

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pit_spell_req(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *local_30;
  char *s;
  char *flags;
  pit_profile *pit;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"spells");
    if (_Var1) {
      pcVar4 = parser_getstr(p,"spells");
      pcVar4 = string_make(pcVar4);
      local_30 = strtok(pcVar4," |");
      while (local_30 != (char *)0x0) {
        eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x44),0xd,r_info_spell_flags,local_30);
        if (eVar2 != 0) {
          mem_free(pcVar4);
          return PARSE_ERROR_INVALID_FLAG;
        }
        local_30 = strtok((char *)0x0," |");
      }
      mem_free(pcVar4);
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_pit_spell_req(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	char *flags;
	char *s;

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!parser_hasval(p, "spells"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "spells"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(pit->spell_flags, RSF_SIZE, r_info_spell_flags, s)) {
			mem_free(flags);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}
	
	mem_free(flags);
	return PARSE_ERROR_NONE;
}